

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O1

void Imf_2_5::copyFromFrameBuffer
               (char **writePtr,char **readPtr,char *endPtr,size_t xStride,Format format,
               PixelType type)

{
  char *pcVar1;
  ArgExc *this;
  char *pcVar2;
  long lVar4;
  undefined2 local_12;
  undefined4 local_10;
  undefined4 local_c;
  char *pcVar3;
  
  pcVar2 = *writePtr;
  pcVar1 = *readPtr;
  if (format == XDR) {
    if (type == UINT) {
      if (endPtr < pcVar1) goto LAB_004797ac;
      do {
        pcVar3 = pcVar2;
        local_10 = *(undefined4 *)pcVar1;
        lVar4 = 0;
        do {
          pcVar3[lVar4] = *(char *)((long)&local_10 + lVar4);
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 != 4);
        pcVar1 = pcVar1 + xStride;
        pcVar2 = pcVar3 + lVar4;
      } while (pcVar1 <= endPtr);
    }
    else if (type == HALF) {
      if (endPtr < pcVar1) goto LAB_004797ac;
      do {
        pcVar3 = pcVar2;
        local_12 = *(undefined2 *)pcVar1;
        lVar4 = 0;
        do {
          pcVar3[lVar4] = *(char *)((long)&local_12 + lVar4);
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 != 2);
        pcVar1 = pcVar1 + xStride;
        pcVar2 = pcVar3 + lVar4;
      } while (pcVar1 <= endPtr);
    }
    else {
      if (type != FLOAT) {
LAB_004797b8:
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(this,"Unknown pixel data type.");
        __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if (endPtr < pcVar1) goto LAB_004797ac;
      do {
        pcVar3 = pcVar2;
        local_c = *(undefined4 *)pcVar1;
        lVar4 = 0;
        do {
          pcVar3[lVar4] = *(char *)((long)&local_c + lVar4);
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 != 4);
        pcVar1 = pcVar1 + xStride;
        pcVar2 = pcVar3 + lVar4;
      } while (pcVar1 <= endPtr);
    }
  }
  else if (type == UINT) {
    if (endPtr < pcVar1) goto LAB_004797ac;
    do {
      pcVar3 = pcVar2;
      lVar4 = 0;
      do {
        pcVar3[lVar4] = pcVar1[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      pcVar1 = pcVar1 + xStride;
      lVar4 = 4;
      pcVar2 = pcVar3 + 4;
    } while (pcVar1 <= endPtr);
  }
  else {
    if (type == HALF) {
      for (; pcVar1 <= endPtr; pcVar1 = pcVar1 + xStride) {
        *(undefined2 *)pcVar2 = *(undefined2 *)pcVar1;
        pcVar2 = pcVar2 + 2;
      }
      goto LAB_004797ac;
    }
    if (type != FLOAT) goto LAB_004797b8;
    if (endPtr < pcVar1) goto LAB_004797ac;
    do {
      pcVar3 = pcVar2;
      lVar4 = 0;
      do {
        pcVar3[lVar4] = pcVar1[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      pcVar1 = pcVar1 + xStride;
      pcVar2 = pcVar3 + 4;
    } while (pcVar1 <= endPtr);
    lVar4 = 4;
  }
  pcVar2 = pcVar3 + lVar4;
LAB_004797ac:
  *writePtr = pcVar2;
  *readPtr = pcVar1;
  return;
}

Assistant:

void
copyFromFrameBuffer (char *& writePtr,
		     const char *& readPtr,
                     const char * endPtr,
		     size_t xStride,
                     Compressor::Format format,
		     PixelType type)
{
    char * localWritePtr = writePtr;
    const char * localReadPtr = readPtr;
    //
    // Copy a horizontal row of pixels from a frame
    // buffer to an output file's line or tile buffer.
    //

    if (format == Compressor::XDR)
    {
        //
        // The the line or tile buffer is in XDR format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            while (localReadPtr <= endPtr)
            {
                Xdr::write <CharPtrIO> (localWritePtr,
                                        *(const unsigned int *) localReadPtr);
                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            while (localReadPtr <= endPtr)
            {
                Xdr::write <CharPtrIO> (localWritePtr, *(const half *) localReadPtr);
                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            while (localReadPtr <= endPtr)
            {
                Xdr::write <CharPtrIO> (localWritePtr, *(const float *) localReadPtr);
                localReadPtr += xStride;
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The the line or tile buffer is in NATIVE format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            while (localReadPtr <= endPtr)
            {
                for (size_t i = 0; i < sizeof (unsigned int); ++i)
                    *localWritePtr++ = localReadPtr[i];

                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            while (localReadPtr <= endPtr)
            {
                *(half *) localWritePtr = *(const half *) localReadPtr;
                localWritePtr += sizeof (half);
                localReadPtr += xStride;
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            while (localReadPtr <= endPtr)
            {
                for (size_t i = 0; i < sizeof (float); ++i)
                    *localWritePtr++ = localReadPtr[i];

                localReadPtr += xStride;
            }
            break;
            
          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }

    writePtr = localWritePtr;
    readPtr = localReadPtr;
}